

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

ImVector_ImDrawCmd * ImVector_ImDrawCmd_ImVector_ImDrawCmdVector(ImVector_ImDrawCmd *src)

{
  uint uVar1;
  ImVector_ImDrawCmd *pIVar2;
  ImDrawCmd *__dest;
  ulong uVar3;
  
  pIVar2 = (ImVector_ImDrawCmd *)ImGui::MemAlloc(0x10);
  pIVar2->Size = 0;
  pIVar2->Capacity = 0;
  pIVar2->Data = (ImDrawCmd *)0x0;
  uVar1 = src->Size;
  if ((long)(int)uVar1 < 1) {
    __dest = (ImDrawCmd *)0x0;
  }
  else {
    uVar3 = 8;
    if (8 < uVar1) {
      uVar3 = (ulong)uVar1;
    }
    __dest = (ImDrawCmd *)ImGui::MemAlloc(uVar3 * 0x38);
    if (pIVar2->Data != (ImDrawCmd *)0x0) {
      memcpy(__dest,pIVar2->Data,(long)pIVar2->Size * 0x38);
      ImGui::MemFree(pIVar2->Data);
    }
    pIVar2->Data = __dest;
    pIVar2->Capacity = (int)uVar3;
  }
  pIVar2->Size = uVar1;
  memcpy(__dest,src->Data,(long)(int)uVar1 * 0x38);
  return pIVar2;
}

Assistant:

CIMGUI_API ImVector_ImDrawCmd* ImVector_ImDrawCmd_ImVector_ImDrawCmdVector(const ImVector_ImDrawCmd src)
{
    return IM_NEW(ImVector_ImDrawCmd)(src);
}